

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMAController.cpp
# Opt level: O1

ssize_t __thiscall
Atari::ST::DMAController::read(DMAController *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  uint uVar3;
  
  sVar2 = CONCAT62((int6)((ulong)in_RAX >> 0x10),0xffff);
  uVar3 = (__fd & 7U) - 2;
  if (4 < uVar3) {
    return sVar2;
  }
  switch(__fd & 7U) {
  case 2:
    uVar1 = this->control_;
    if ((uVar1 & 0x10) != 0) {
      return (ulong)(this->byte_count_ + 0x1ffU >> 9);
    }
    if ((uVar1 & 8) != 0) {
      return sVar2;
    }
    sVar2 = WD::WD1770::read(&(this->fdc_).super_WD1770,(uint)(uVar1 >> 1),
                             (void *)((long)&switchD_00312da1::switchdataD_004c8180 +
                                     (long)(int)(&switchD_00312da1::switchdataD_004c8180)[uVar3]),
                             0x4c8180);
    return (ulong)((uint)sVar2 & 0xff | 0xff00);
  case 3:
    return (ulong)(((int)this->error_ ^ 0xfffffff9U) + (uint)(this->byte_count_ != 0) * 2 +
                  (uint)(this->fdc_).super_WD1770.status_.data_request * 4);
  case 4:
    uVar3 = (uint)*(ushort *)((long)&this->address_ + 2);
    break;
  case 5:
    uVar3 = (uint)*(byte *)((long)&this->address_ + 1);
    break;
  case 6:
    return (ulong)(this->address_ | 0xff00);
  }
  return (ulong)(uVar3 | 0xff00);
}

Assistant:

uint16_t DMAController::read(int address) {
	switch(address & 7) {
		// Reserved.
		default: break;

		// Disk controller or sector count.
		case 2:
			if(control_ & Control::SectorCountSelect) {
				return uint16_t((byte_count_ + 511) >> 9);	// Assumed here: the count is of sectors remaining, i.e. it decrements
															// only when a sector is complete.
			} else {
				if(control_ & Control::CPUTarget) {
					return 0xffff;
				} else {
					return 0xff00 | fdc_.read(control_ >> 1);
				}
			}
		break;

		// DMA status.
		case 3:
		// TODO: should DRQ come from the HDC if that mode is selected?
		return 0xfff8 | (error_ ? 0 : 1) | (byte_count_ ? 2 : 0) | (fdc_.get_data_request_line() ? 4 : 0);

		// DMA addressing.
		case 4:	return uint16_t(0xff00 | ((address_ >> 16) & 0xff));
		case 5:	return uint16_t(0xff00 | ((address_ >> 8) & 0xff));
		case 6:	return uint16_t(0xff00 | ((address_ >> 0) & 0xff));
	}
	return 0xffff;
}